

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O1

RGBA tcu::computeAbsDiffMasked(RGBA a,RGBA b,deUint32 cmpMask)

{
  uint uVar1;
  uint uVar2;
  deUint32 bPacked;
  deUint32 aPacked;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = 0;
  uVar2 = 0;
  if ((cmpMask & 1) != 0) {
    uVar5 = (a.m_value & 0xff) - (b.m_value & 0xff);
    uVar2 = -uVar5;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar2 = uVar2 & 0xff;
  }
  if ((cmpMask & 2) != 0) {
    uVar5 = (a.m_value >> 8 & 0xff) - (b.m_value >> 8 & 0xff);
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    uVar1 = (uVar1 & 0xff) << 8;
  }
  uVar5 = 0;
  uVar6 = 0;
  if ((cmpMask & 4) != 0) {
    uVar7 = (a.m_value >> 0x10 & 0xff) - (b.m_value >> 0x10 & 0xff);
    uVar6 = -uVar7;
    if (0 < (int)uVar7) {
      uVar6 = uVar7;
    }
    uVar6 = (uVar6 & 0xff) << 0x10;
  }
  if ((cmpMask & 8) != 0) {
    iVar3 = (a.m_value >> 0x18) - (b.m_value >> 0x18);
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    uVar5 = iVar4 << 0x18;
  }
  return (RGBA)(uVar1 | uVar2 | uVar6 | uVar5);
}

Assistant:

RGBA computeAbsDiffMasked (RGBA a, RGBA b, deUint32 cmpMask)
{
	deUint32	aPacked = a.getPacked();
	deUint32	bPacked = b.getPacked();
	deUint8		rDiff	= 0;
	deUint8		gDiff	= 0;
	deUint8		bDiff	= 0;
	deUint8		aDiff	= 0;

	if (cmpMask & RGBA::RED_MASK)
	{
		int ra = (aPacked >> RGBA::RED_SHIFT) & 0xFF;
		int rb = (bPacked >> RGBA::RED_SHIFT) & 0xFF;

		rDiff = (deUint8)deAbs32(ra - rb);
	}

	if (cmpMask & RGBA::GREEN_MASK)
	{
		int ga = (aPacked >> RGBA::GREEN_SHIFT) & 0xFF;
		int gb = (bPacked >> RGBA::GREEN_SHIFT) & 0xFF;

		gDiff = (deUint8)deAbs32(ga - gb);
	}

	if (cmpMask & RGBA::BLUE_MASK)
	{
		int ba = (aPacked >> RGBA::BLUE_SHIFT) & 0xFF;
		int bb = (bPacked >> RGBA::BLUE_SHIFT) & 0xFF;

		bDiff = (deUint8)deAbs32(ba - bb);
	}

	if (cmpMask & RGBA::ALPHA_MASK)
	{
		int aa = (aPacked >> RGBA::ALPHA_SHIFT) & 0xFF;
		int ab = (bPacked >> RGBA::ALPHA_SHIFT) & 0xFF;

		aDiff = (deUint8)deAbs32(aa - ab);
	}

	return RGBA(rDiff,gDiff,bDiff,aDiff);
}